

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugMacro.cpp
# Opt level: O1

void __thiscall llvm::DWARFDebugMacro::parse(DWARFDebugMacro *this,DataExtractor data)

{
  void *pvVar1;
  bool bVar2;
  ulong uVar3;
  uint64_t uVar4;
  char *pcVar5;
  pointer this_00;
  uint64_t local_38;
  uint64_t Offset;
  
  local_38 = 0;
  if (data.Data.Length != 0) {
    this_00 = (pointer)0x0;
    do {
      if (this_00 == (pointer)0x0) {
        std::
        vector<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>,_std::allocator<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>_>_>
        ::emplace_back<>(&this->MacroLists);
        this_00 = (this->MacroLists).
                  super__Vector_base<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>,_std::allocator<llvm::SmallVector<llvm::DWARFDebugMacro::Entry,_4U>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
      }
      SmallVectorImpl<llvm::DWARFDebugMacro::Entry>::emplace_back<>
                (&this_00->super_SmallVectorImpl<llvm::DWARFDebugMacro::Entry>);
      uVar3 = (ulong)(this_00->super_SmallVectorImpl<llvm::DWARFDebugMacro::Entry>).
                     super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>.
                     super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
                     super_SmallVectorBase.Size;
      if (uVar3 == 0) {
        __assert_fail("!empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                      ,0xa7,
                      "reference llvm::SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry>::back() [T = llvm::DWARFDebugMacro::Entry]"
                     );
      }
      pvVar1 = (this_00->super_SmallVectorImpl<llvm::DWARFDebugMacro::Entry>).
               super_SmallVectorTemplateBase<llvm::DWARFDebugMacro::Entry,_true>.
               super_SmallVectorTemplateCommon<llvm::DWARFDebugMacro::Entry,_void>.
               super_SmallVectorBase.BeginX;
      uVar4 = DataExtractor::getULEB128(&data,&local_38,(Error *)0x0);
      *(int *)((long)pvVar1 + uVar3 * 0x18 + -0x18) = (int)uVar4;
      switch(uVar4 & 0xffffffff) {
      case 0:
        bVar2 = false;
        break;
      case 1:
      case 2:
switchD_00d823ca_caseD_1:
        uVar4 = DataExtractor::getULEB128(&data,&local_38,(Error *)0x0);
        *(uint64_t *)((long)pvVar1 + uVar3 * 0x18 + -0x10) = uVar4;
        pcVar5 = DataExtractor::getCStr(&data,&local_38);
        goto LAB_00d82425;
      case 3:
        uVar4 = DataExtractor::getULEB128(&data,&local_38,(Error *)0x0);
        *(uint64_t *)((long)pvVar1 + uVar3 * 0x18 + -0x10) = uVar4;
        pcVar5 = (char *)DataExtractor::getULEB128(&data,&local_38,(Error *)0x0);
LAB_00d82425:
        *(char **)((long)pvVar1 + uVar3 * 0x18 + -8) = pcVar5;
switchD_00d823ca_caseD_4:
        bVar2 = false;
        break;
      case 4:
        goto switchD_00d823ca_caseD_4;
      default:
        if ((int)uVar4 == 0xff) goto switchD_00d823ca_caseD_1;
        *(undefined4 *)((long)pvVar1 + uVar3 * 0x18 + -0x18) = 0xffffffff;
        bVar2 = true;
      }
    } while ((!bVar2) && (local_38 < data.Data.Length));
  }
  return;
}

Assistant:

void DWARFDebugMacro::parse(DataExtractor data) {
  uint64_t Offset = 0;
  MacroList *M = nullptr;
  while (data.isValidOffset(Offset)) {
    if (!M) {
      MacroLists.emplace_back();
      M = &MacroLists.back();
    }
    // A macro list entry consists of:
    M->emplace_back();
    Entry &E = M->back();
    // 1. Macinfo type
    E.Type = data.getULEB128(&Offset);

    if (E.Type == 0) {
      // Reached end of a ".debug_macinfo" section contribution.
      continue;
    }

    switch (E.Type) {
    default:
      // Got a corrupted ".debug_macinfo" section (invalid macinfo type).
      // Push the corrupted entry to the list and halt parsing.
      E.Type = DW_MACINFO_invalid;
      return;
    case DW_MACINFO_define:
    case DW_MACINFO_undef:
      // 2. Source line
      E.Line = data.getULEB128(&Offset);
      // 3. Macro string
      E.MacroStr = data.getCStr(&Offset);
      break;
    case DW_MACINFO_start_file:
      // 2. Source line
      E.Line = data.getULEB128(&Offset);
      // 3. Source file id
      E.File = data.getULEB128(&Offset);
      break;
    case DW_MACINFO_end_file:
      break;
    case DW_MACINFO_vendor_ext:
      // 2. Vendor extension constant
      E.ExtConstant = data.getULEB128(&Offset);
      // 3. Vendor extension string
      E.ExtStr = data.getCStr(&Offset);
      break;
    }
  }
}